

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

Argument * __thiscall
argparse::ArgumentParser::add_argument<char_const*,char_const*>
          (ArgumentParser *this,char *Fargs,char *Fargs_1)

{
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *__position;
  size_t sVar1;
  iterator argIt;
  __off64_t *in_R8;
  size_t in_R9;
  uint __flags;
  
  __position = &this->mOptionalArguments;
  sVar1 = strlen(Fargs);
  __flags = (uint)sVar1;
  strlen(Fargs_1);
  argIt = std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>::
          emplace<std::basic_string_view<char,std::char_traits<char>>[2]>
                    ((list<argparse::Argument,std::allocator<argparse::Argument>> *)__position,
                     (const_iterator)__position,
                     (basic_string_view<char,_std::char_traits<char>_> (*) [2])
                     &stack0xffffffffffffffb8);
  if (((ulong)argIt._M_node[0xb]._M_prev & 0x100000000) == 0) {
    std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::splice
              (&this->mPositionalArguments,(int)&this->mPositionalArguments,(__off64_t *)__position,
               (int)argIt._M_node,in_R8,in_R9,__flags);
  }
  index_argument(this,(list_iterator)argIt._M_node);
  return (Argument *)(argIt._M_node + 1);
}

Assistant:

Argument &add_argument(Targs... Fargs) {
    using array_of_sv = std::string_view[sizeof...(Targs)];
    auto tArgument = mOptionalArguments.emplace(cend(mOptionalArguments),
                                                array_of_sv{Fargs...});

    if (!tArgument->mIsOptional)
      mPositionalArguments.splice(cend(mPositionalArguments),
                                  mOptionalArguments, tArgument);

    index_argument(tArgument);
    return *tArgument;
  }